

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O1

REF_STATUS collar(REF_MPI ref_mpi,int argc,char **argv)

{
  REF_NODE pRVar1;
  bool bVar2;
  REF_INT RVar3;
  char **ppcVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  undefined4 uVar10;
  undefined8 extraout_RDX;
  undefined7 uVar12;
  undefined8 uVar11;
  char *pcVar13;
  char *__format;
  REF_BOOL RVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  undefined4 *puVar18;
  ulong uVar19;
  char cVar20;
  double dVar21;
  char **ppcVar22;
  REF_GRID_conflict ref_grid;
  REF_INT pos;
  REF_DICT faceids;
  char inflate_flat [5];
  REF_DBL rate;
  char inflate_radial [7];
  char inflate_normal [7];
  REF_DBL origin [3];
  REF_GRID_conflict local_100;
  REF_INT local_f4;
  char *local_f0;
  char **local_e8;
  REF_DICT local_e0;
  uint local_d4;
  REF_MPI local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  undefined4 local_a0;
  undefined1 local_9c;
  double local_98;
  double local_90;
  int local_84;
  undefined4 local_80;
  REF_BOOL local_7c;
  undefined4 local_78;
  undefined3 uStack_74;
  undefined4 local_70;
  undefined3 uStack_6c;
  double local_68;
  double local_60;
  char *local_58;
  char **local_50;
  double local_48;
  undefined4 *local_40;
  undefined8 local_38;
  
  uStack_6c = 0x6c61;
  local_70 = 0x6d726f6e;
  local_9c = 0;
  local_a0 = 0x74616c66;
  uStack_74 = 0x6c61;
  local_78 = 0x69646172;
  local_100 = (REF_GRID)0x0;
  local_f4 = -1;
  uVar6 = ref_args_find(argc,argv,"--debug",&local_f4);
  RVar3 = local_f4;
  if ((uVar6 == 0) || (uVar6 == 5)) {
    if (local_f4 == -1) {
      RVar14 = 0;
    }
    else {
      RVar14 = 1;
      if (ref_mpi->id == 0) {
        printf(" --debug %d\n",1);
      }
    }
    if (argc < 8) {
      if (ref_mpi->id == 0) {
        pcVar13 = "not enough required arguments";
LAB_00114795:
        puts(pcVar13);
      }
LAB_0011479a:
      if (ref_mpi->id == 0) {
        collar_help(*argv);
      }
      uVar6 = ref_grid_free(local_100);
      if (uVar6 != 0) {
        pcVar13 = "grid";
        uVar11 = 0x795;
        goto LAB_001147de;
      }
    }
    else {
      pcVar13 = argv[2];
      local_f0 = argv[3];
      local_7c = RVar14;
      local_d4 = atoi(argv[4]);
      local_b8 = atof(argv[5]);
      local_a8 = atof(argv[6]);
      dVar21 = atof(argv[7]);
      uVar7 = local_d4;
      cVar20 = *pcVar13;
      local_c0 = (double)CONCAT44(local_c0._4_4_,RVar3);
      if (cVar20 == 'f') {
        puVar18 = &local_a0;
        uVar11 = 1;
        uVar10 = 0;
      }
      else {
        uVar11 = 0;
        uVar12 = (undefined7)((ulong)extraout_RDX >> 8);
        if (cVar20 == 'n') {
          puVar18 = &local_70;
          uVar10 = (undefined4)CONCAT71(uVar12,1);
        }
        else {
          uVar10 = (undefined4)CONCAT71(uVar12,cVar20 != 'r');
          puVar18 = &local_78;
          if (cVar20 != 'r') {
            puVar18 = (undefined4 *)0x0;
          }
        }
      }
      if (puVar18 == (undefined4 *)0x0) {
        if (ref_mpi->id == 0) {
          printf("unable to parse inflate method >%s<\n",pcVar13);
        }
        goto LAB_0011479a;
      }
      if (ref_mpi->id == 0) {
        local_e8 = argv;
        local_c8 = (double)(ulong)(uint)argc;
        local_b0 = dVar21;
        printf("inflation method %s\n",puVar18);
        printf("number of layers %d\n",(ulong)uVar7);
        printf("first thickness %f\n",local_b8);
        printf("total thickness %f\n",local_a8);
        printf("mach %f\n",local_b0);
        argc = SUB84(local_c8,0);
        argv = local_e8;
        dVar21 = local_b0;
      }
      if (((((int)uVar7 < 1) || (local_b8 <= 0.0)) || (local_a8 <= 0.0)) || (dVar21 <= 1.0)) {
        if (ref_mpi->id == 0) {
          pcVar13 = "number of layers and thicknesses must be positive and Mach supersonic";
          goto LAB_00114795;
        }
        goto LAB_0011479a;
      }
      local_b0 = dVar21;
      local_80 = uVar10;
      local_40 = puVar18;
      local_38 = uVar11;
      local_c8 = asin(1.0 / dVar21);
      uVar7 = ref_inflate_rate(uVar7,local_b8,local_a8,&local_90);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x6d1,"collar",(ulong)uVar7,"compute rate");
        return uVar7;
      }
      if (ref_mpi->id == 0) {
        printf("layer growth rate %f\n",local_90);
        printf("mach angle %f rad %f deg\n",local_c8,(local_c8 * 180.0) / 3.14159265358979);
      }
      uVar7 = ref_dict_create(&local_e0);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x6d9,"collar",(ulong)uVar7,"create");
        return uVar7;
      }
      uVar7 = ref_args_find(argc,argv,"--fun3d-mapbc",&local_f4);
      if ((uVar7 != 0) && (uVar7 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x6dc,"collar",(ulong)uVar7,"arg search");
        uVar6 = uVar7;
      }
      if ((uVar7 != 5) && (uVar7 != 0)) {
        return uVar6;
      }
      if ((long)local_f4 != -1) {
        if (local_f4 < argc + -1) {
          cVar20 = '\0';
          if (ref_mpi->id == 0) {
            pcVar13 = argv[(long)local_f4 + 1];
            printf("reading fun3d bc map %s\n",pcVar13);
            uVar7 = ref_phys_read_mapbc_token(local_e0,pcVar13,"inflate");
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x6e9,"collar",(ulong)uVar7,"unable to read fun3d formatted mapbc");
              uVar6 = uVar7;
            }
            cVar20 = uVar7 != 0;
          }
        }
        else {
          cVar20 = '\x02';
          if (ref_mpi->id == 0) {
            puts("--fun3d-mapbc requires a filename");
          }
        }
        if (cVar20 == '\x02') goto LAB_0011479a;
        if (cVar20 != '\0') {
          return uVar6;
        }
      }
      uVar7 = ref_args_find(argc,argv,"--usm3d-mapbc",&local_f4);
      if ((uVar7 != 0) && (uVar7 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x6ee,"collar",(ulong)uVar7,"arg search");
        uVar6 = uVar7;
      }
      if ((uVar7 != 5) && (uVar7 != 0)) {
        return uVar6;
      }
      lVar15 = (long)local_f4;
      if (lVar15 != -1) {
        if (local_f4 < argc + -3) {
          cVar20 = '\0';
          if (ref_mpi->id == 0) {
            uVar7 = atoi(argv[lVar15 + 3]);
            pcVar13 = argv[lVar15 + 1];
            local_e8 = (char **)argv[lVar15 + 2];
            printf("reading usm3d bc map %s family %s bc %d\n",pcVar13,local_e8,(ulong)uVar7);
            uVar7 = ref_inflate_read_usm3d_mapbc(local_e0,pcVar13,(char *)local_e8,uVar7);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x700,"collar",(ulong)uVar7,"faceids from mapbc");
              uVar6 = uVar7;
            }
            cVar20 = uVar7 != 0;
          }
        }
        else {
          cVar20 = '\x02';
          if (ref_mpi->id == 0) {
            puts("--usm3d-mapbc requires a filename, family, and bc type");
          }
        }
        if (cVar20 == '\x02') goto LAB_0011479a;
        if (cVar20 != '\0') {
          return uVar6;
        }
      }
      uVar7 = ref_dict_bcast(local_e0,ref_mpi);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x704,"collar",(ulong)uVar7,"bcast");
        return uVar7;
      }
      if (ref_mpi->id == 0) {
        printf("inflating %d faces\n",(ulong)(uint)local_e0->n);
      }
      if (local_e0->n < 1) {
        if (ref_mpi->id == 0) {
          pcVar13 = "no faces to inflate, use --fun3d-mapbc or --usm3d-mapbc";
          goto LAB_00114795;
        }
        goto LAB_0011479a;
      }
      ref_mpi_stopwatch_start(ref_mpi);
      if (ref_mpi->n < 2) {
        if (ref_mpi->id == 0) {
          printf("import %s\n",local_f0);
        }
        uVar7 = ref_import_by_extension(&local_100,ref_mpi,local_f0);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x71b,"collar",(ulong)uVar7,"import");
          return uVar7;
        }
        pcVar13 = "core import";
        local_e8 = argv;
      }
      else {
        if (ref_mpi->id == 0) {
          printf("part %s\n",local_f0);
        }
        uVar7 = ref_part_by_extension(&local_100,ref_mpi,local_f0);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x713,"collar",(ulong)uVar7,"part");
          return uVar7;
        }
        local_e8 = argv;
        ref_mpi_stopwatch_stop(ref_mpi,"core part");
        uVar7 = ref_migrate_to_balance(local_100);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x715,"collar",(ulong)uVar7,"balance");
          return uVar7;
        }
        ref_mpi_stopwatch_stop(ref_mpi,"balance core");
        uVar7 = ref_grid_pack(local_100);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x717,"collar",(ulong)uVar7,"pack");
          return uVar7;
        }
        pcVar13 = "pack core";
      }
      ref_mpi_stopwatch_stop(ref_mpi,pcVar13);
      local_d0 = ref_mpi;
      if (ref_mpi->id == 0) {
        printf("  read %ld vertices\n",local_100->node->old_n_global);
      }
      uVar7 = ref_args_find(argc,local_e8,"--rotate",&local_f4);
      if ((uVar7 != 0) && (uVar7 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x723,"collar",(ulong)uVar7,"rotate search");
        uVar6 = uVar7;
      }
      RVar3 = local_f4;
      if ((uVar7 != 5) && (uVar7 != 0)) {
        return uVar6;
      }
      if ((long)local_f4 != -1) {
        local_84 = argc + -1;
        if (local_f4 < local_84) {
          pRVar1 = local_100->node;
          dVar21 = atof(local_e8[(long)local_f4 + 1]);
          local_f0 = (char *)((dVar21 / 180.0) * 3.14159265358979);
          if (local_d0->id == 0) {
            printf(" --rotate %f deg (%f rad)\n",dVar21,local_f0);
          }
          if (0 < pRVar1->max) {
            lVar16 = 0;
            lVar15 = 0;
            do {
              if (-1 < pRVar1->global[lVar15]) {
                local_60 = *(double *)((long)pRVar1->real + lVar16);
                local_68 = *(double *)((long)pRVar1->real + lVar16 + 0x10);
                local_98 = cos((double)local_f0);
                dVar21 = sin((double)local_f0);
                *(double *)((long)pRVar1->real + lVar16) = local_98 * local_60 - dVar21 * local_68;
                local_98 = sin((double)local_f0);
                dVar21 = cos((double)local_f0);
                *(double *)((long)pRVar1->real + lVar16 + 0x10) =
                     local_98 * local_60 + dVar21 * local_68;
              }
              lVar15 = lVar15 + 1;
              lVar16 = lVar16 + 0x78;
            } while (lVar15 < pRVar1->max);
          }
        }
        else {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x729,"collar","--rotate requires a value");
          uVar6 = 1;
        }
        if (local_84 <= RVar3) {
          return uVar6;
        }
      }
      ppcVar4 = local_e8;
      uVar7 = ref_args_find(argc,local_e8,"--origin",&local_f4);
      if ((uVar7 != 0) && (uVar7 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0x73a,"collar",(ulong)uVar7,"origin search");
        uVar6 = uVar7;
      }
      if ((uVar7 != 5) && (uVar7 != 0)) {
        return uVar6;
      }
      lVar15 = (long)local_f4;
      if (lVar15 == -1) {
        uVar7 = ref_inflate_origin(local_100,local_e0,(REF_DBL *)&local_58);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x744,"collar",(ulong)uVar7,"orig");
          return uVar7;
        }
        if (local_d0->id == 0) {
          __format = " --origin %f %f %f inferred from z-midpoint\n";
          pcVar13 = local_58;
          ppcVar22 = local_50;
LAB_00114f2b:
          printf(__format,pcVar13,ppcVar22);
        }
LAB_00114f32:
        if (local_c0._0_4_ != -1) {
          uVar7 = ref_gather_tec_movie_record_button(local_100->gather,1);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x74c,"collar",(ulong)uVar7,"movie on");
            return uVar7;
          }
          uVar7 = ref_gather_tec_movie_frame(local_100,"core");
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x74d,"collar",(ulong)uVar7,"movie frame");
            return uVar7;
          }
        }
        if (0 < (int)local_d4) {
          local_c0 = 0.0;
          uVar7 = 0;
          do {
            dVar21 = pow(local_90,(double)(int)uVar7);
            local_f0 = (char *)(dVar21 * local_b8);
            dVar21 = tan(local_c8);
            if ((char)local_80 == '\0') {
              uVar8 = ref_inflate_radially
                                (local_100,local_e0,(REF_DBL *)&local_58,(REF_DBL)local_f0,local_c8,
                                 0.0,(REF_BOOL)local_38,local_7c);
              if (uVar8 != 0) {
                uVar11 = 0x759;
                uVar6 = uVar8;
                goto LAB_001150c0;
              }
            }
            else {
              uVar8 = ref_inflate_face(local_100,local_e0,(REF_DBL *)&local_58,(REF_DBL)local_f0,
                                       (double)local_f0 / dVar21);
              if (uVar8 != 0) {
                uVar11 = 0x75c;
                uVar6 = uVar8;
LAB_001150c0:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                       ,uVar11,"collar",(ulong)uVar6,"inflate");
                uVar8 = uVar6;
              }
            }
            uVar5 = local_d4;
            if (uVar8 != 0) {
              return uVar6;
            }
            local_c0 = local_c0 + (double)local_f0;
            if (local_d0->id == 0) {
              printf("layer%5d of%5d thickness %10.3e total %10.3e %ld nodes\n",local_f0,local_c0,
                     (ulong)(uVar7 + 1),(ulong)local_d4,local_100->node->old_n_global);
            }
            uVar7 = uVar7 + 1;
          } while (uVar5 != uVar7);
        }
        ref_mpi_stopwatch_stop(local_100->mpi,"inflate");
        if (local_d0->id == 0) {
          printf("inflated %d faces\n",(ulong)(uint)local_e0->n);
          printf("mach %f mach angle %f rad %f deg\n",local_b0,local_c8,
                 (local_c8 * 180.0) / 3.14159265358979);
          printf("first thickness %f\n",local_b8);
          printf("total thickness %f\n",local_a8);
          printf("rate %f\n",local_90);
          printf("layers %d\n",(ulong)local_d4);
          printf("inflate method %s\n",local_40);
        }
        iVar17 = 2;
        if (2 < argc) {
          iVar17 = argc;
        }
        bVar2 = true;
        uVar19 = 0;
        do {
          iVar9 = strcmp(ppcVar4[uVar19],"-x");
          if (iVar9 == 0) {
            if (local_d0->n < 2) {
              if (local_d0->id == 0) {
                printf("export %ld nodes to %s\n",local_100->node->old_n_global,ppcVar4[uVar19 + 1])
                ;
              }
              uVar7 = ref_export_by_extension(local_100,ppcVar4[uVar19 + 1]);
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                       ,0x781,"collar",(ulong)uVar7,"export -x");
                uVar6 = uVar7;
              }
              pcVar13 = "export";
            }
            else {
              if (local_d0->id == 0) {
                printf("gather %ld nodes to %s\n",local_100->node->old_n_global,ppcVar4[uVar19 + 1])
                ;
              }
              uVar7 = ref_gather_by_extension(local_100,ppcVar4[uVar19 + 1]);
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                       ,0x77b,"collar",(ulong)uVar7,"gather -x");
                uVar6 = uVar7;
              }
              pcVar13 = "gather";
            }
            if (uVar7 != 0) {
              return uVar6;
            }
            ref_mpi_stopwatch_stop(local_100->mpi,pcVar13);
            bVar2 = false;
          }
          uVar19 = uVar19 + 1;
        } while (iVar17 - 1 != uVar19);
        if (bVar2) {
          if (local_d0->id == 0) {
            printf("gather %ld nodes to %s\n",local_100->node->old_n_global,"inflated.b8.ugrid");
          }
          uVar6 = ref_gather_by_extension(local_100,"inflated.b8.ugrid");
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0x78b,"collar",(ulong)uVar6,"gather");
            return uVar6;
          }
          ref_mpi_stopwatch_stop(local_100->mpi,"gather");
        }
        uVar6 = ref_dict_free(local_e0);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x78f,"collar",(ulong)uVar6,"free");
          return uVar6;
        }
        uVar6 = ref_grid_free(local_100);
        if (uVar6 == 0) {
          return 0;
        }
        pcVar13 = "grid";
        uVar11 = 0x790;
        goto LAB_001147de;
      }
      if (local_f4 < argc + -3) {
        local_f0 = (char *)atof(ppcVar4[lVar15 + 1]);
        local_58 = local_f0;
        local_e8 = (char **)atof(ppcVar4[lVar15 + 2]);
        local_50 = local_e8;
        local_48 = atof(ppcVar4[lVar15 + 3]);
        if (local_d0->id == 0) {
          __format = " --origin %f %f %f from argument\n";
          pcVar13 = local_f0;
          ppcVar22 = local_e8;
          goto LAB_00114f2b;
        }
        goto LAB_00114f32;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x73c,"collar","--origin requires three values");
    }
    uVar6 = 1;
  }
  else {
    pcVar13 = "debug search";
    uVar11 = 0x699;
LAB_001147de:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           uVar11,"collar",(ulong)uVar6,pcVar13);
  }
  return uVar6;
}

Assistant:

static REF_STATUS collar(REF_MPI ref_mpi, int argc, char *argv[]) {
  char *input_filename = NULL;
  char *inflate_arg = NULL;
  char inflate_normal[] = "normal";
  char inflate_flat[] = "flat";
  char inflate_radial[] = "radial";
  char *inflate_method = NULL;
  REF_GRID ref_grid = NULL;
  REF_INT nlayers, layer;
  REF_DBL first_thickness, total_thickness, mach, mach_angle_rad;
  REF_DBL alpha_rad = 0.0;
  REF_DBL thickness, total, xshift;
  REF_DBL rate;
  REF_DICT faceids;
  REF_INT pos, opt;
  REF_DBL origin[3];
  REF_BOOL debug = REF_FALSE;
  REF_BOOL extrude_radially = REF_FALSE;
  REF_BOOL on_rails = REF_FALSE;
  REF_BOOL default_export_filename = REF_TRUE;

  pos = REF_EMPTY;
  RXS(ref_args_find(argc, argv, "--debug", &pos), REF_NOT_FOUND,
      "debug search");
  if (REF_EMPTY != pos) {
    debug = REF_TRUE;
    if (ref_mpi_once(ref_mpi)) printf(" --debug %d\n", (int)debug);
  }

  if (argc < 8) {
    if (ref_mpi_once(ref_mpi)) {
      printf("not enough required arguments\n");
    }
    goto shutdown;
  }
  inflate_arg = argv[2];
  input_filename = argv[3];
  nlayers = atoi(argv[4]);
  first_thickness = atof(argv[5]);
  total_thickness = atof(argv[6]);
  mach = atof(argv[7]);

  inflate_method = NULL;
  if (strncmp(inflate_arg, "n", 1) == 0) {
    inflate_method = inflate_normal;
  } else if (strncmp(inflate_arg, "f", 1) == 0) {
    inflate_method = inflate_flat;
    extrude_radially = REF_TRUE;
    on_rails = REF_TRUE;
  } else if (strncmp(inflate_arg, "r", 1) == 0) {
    inflate_method = inflate_radial;
    extrude_radially = REF_TRUE;
  }
  if (NULL == inflate_method) {
    if (ref_mpi_once(ref_mpi)) {
      printf("unable to parse inflate method >%s<\n", inflate_arg);
    }
    goto shutdown;
  }

  if (ref_mpi_once(ref_mpi)) {
    printf("inflation method %s\n", inflate_method);
    printf("number of layers %d\n", nlayers);
    printf("first thickness %f\n", first_thickness);
    printf("total thickness %f\n", total_thickness);
    printf("mach %f\n", mach);
  }

  if (nlayers <= 0 || first_thickness <= 0.0 || total_thickness <= 0.0 ||
      mach <= 1.0) {
    if (ref_mpi_once(ref_mpi)) {
      printf(
          "number of layers and thicknesses must be positive and "
          "Mach supersonic\n");
    }
    goto shutdown;
  }
  mach_angle_rad = asin(1 / mach);
  RSS(ref_inflate_rate(nlayers, first_thickness, total_thickness, &rate),
      "compute rate");

  if (ref_mpi_once(ref_mpi)) {
    printf("layer growth rate %f\n", rate);
    printf("mach angle %f rad %f deg\n", mach_angle_rad,
           ref_math_in_degrees(mach_angle_rad));
  }

  RSS(ref_dict_create(&faceids), "create");

  RXS(ref_args_find(argc, argv, "--fun3d-mapbc", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    const char *mapbc;
    if (pos >= argc - 1) {
      if (ref_mpi_once(ref_mpi)) {
        printf("--fun3d-mapbc requires a filename\n");
      }
      goto shutdown;
    }
    mapbc = argv[pos + 1];
    if (ref_mpi_once(ref_mpi)) {
      printf("reading fun3d bc map %s\n", mapbc);
      RSS(ref_phys_read_mapbc_token(faceids, mapbc, "inflate"),
          "unable to read fun3d formatted mapbc");
    }
  }

  RXS(ref_args_find(argc, argv, "--usm3d-mapbc", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    const char *mapbc;
    const char *family_name;
    REF_INT bc_type;
    if (pos >= argc - 3) {
      if (ref_mpi_once(ref_mpi)) {
        printf("--usm3d-mapbc requires a filename, family, and bc type\n");
      }
      goto shutdown;
    }
    mapbc = argv[pos + 1];
    family_name = argv[pos + 2];
    bc_type = atoi(argv[pos + 3]);
    if (ref_mpi_once(ref_mpi)) {
      printf("reading usm3d bc map %s family %s bc %d\n", mapbc, family_name,
             bc_type);
      RSS(ref_inflate_read_usm3d_mapbc(faceids, mapbc, family_name, bc_type),
          "faceids from mapbc");
    }
  }

  RSS(ref_dict_bcast(faceids, ref_mpi), "bcast");
  if (ref_mpi_once(ref_mpi)) {
    printf("inflating %d faces\n", ref_dict_n(faceids));
  }
  if (ref_dict_n(faceids) <= 0) {
    if (ref_mpi_once(ref_mpi)) {
      printf("no faces to inflate, use --fun3d-mapbc or --usm3d-mapbc\n");
    }
    goto shutdown;
  }

  ref_mpi_stopwatch_start(ref_mpi);

  if (ref_mpi_para(ref_mpi)) {
    if (ref_mpi_once(ref_mpi)) printf("part %s\n", input_filename);
    RSS(ref_part_by_extension(&ref_grid, ref_mpi, input_filename), "part");
    ref_mpi_stopwatch_stop(ref_mpi, "core part");
    RSS(ref_migrate_to_balance(ref_grid), "balance");
    ref_mpi_stopwatch_stop(ref_mpi, "balance core");
    RSS(ref_grid_pack(ref_grid), "pack");
    ref_mpi_stopwatch_stop(ref_mpi, "pack core");
  } else {
    if (ref_mpi_once(ref_mpi)) printf("import %s\n", input_filename);
    RSS(ref_import_by_extension(&ref_grid, ref_mpi, input_filename), "import");
    ref_mpi_stopwatch_stop(ref_mpi, "core import");
  }
  if (ref_mpi_once(ref_mpi))
    printf("  read " REF_GLOB_FMT " vertices\n",
           ref_node_n_global(ref_grid_node(ref_grid)));

  RXS(ref_args_find(argc, argv, "--rotate", &pos), REF_NOT_FOUND,
      "rotate search");
  if (REF_EMPTY != pos) {
    REF_DBL rotate_deg, rotate_rad;
    REF_NODE ref_node = ref_grid_node(ref_grid);
    REF_INT node;
    REF_DBL x, z;
    if (pos >= argc - 1) THROW("--rotate requires a value");
    rotate_deg = atof(argv[pos + 1]);
    rotate_rad = ref_math_in_radians(rotate_deg);
    if (ref_mpi_once(ref_mpi))
      printf(" --rotate %f deg (%f rad)\n", rotate_deg, rotate_rad);

    each_ref_node_valid_node(ref_node, node) {
      x = ref_node_xyz(ref_node, 0, node);
      z = ref_node_xyz(ref_node, 2, node);
      ref_node_xyz(ref_node, 0, node) =
          x * cos(rotate_rad) - z * sin(rotate_rad);
      ref_node_xyz(ref_node, 2, node) =
          x * sin(rotate_rad) + z * cos(rotate_rad);
    }
  }

  RXS(ref_args_find(argc, argv, "--origin", &pos), REF_NOT_FOUND,
      "origin search");
  if (REF_EMPTY != pos) {
    if (pos >= argc - 3) THROW("--origin requires three values");
    origin[0] = atof(argv[pos + 1]);
    origin[1] = atof(argv[pos + 2]);
    origin[2] = atof(argv[pos + 3]);
    if (ref_mpi_once(ref_mpi))
      printf(" --origin %f %f %f from argument\n", origin[0], origin[1],
             origin[2]);
  } else {
    RSS(ref_inflate_origin(ref_grid, faceids, origin), "orig");
    if (ref_mpi_once(ref_mpi))
      printf(" --origin %f %f %f inferred from z-midpoint\n", origin[0],
             origin[1], origin[2]);
  }

  if (debug) {
    RSS(ref_gather_tec_movie_record_button(ref_grid_gather(ref_grid), REF_TRUE),
        "movie on");
    ref_gather_blocking_frame(ref_grid, "core");
  }

  total = 0.0;
  for (layer = 0; layer < nlayers; layer++) {
    thickness = first_thickness * pow(rate, layer);
    total = total + thickness;
    xshift = thickness / tan(mach_angle_rad);

    if (extrude_radially) {
      RSS(ref_inflate_radially(ref_grid, faceids, origin, thickness,
                               mach_angle_rad, alpha_rad, on_rails, debug),
          "inflate");
    } else {
      RSS(ref_inflate_face(ref_grid, faceids, origin, thickness, xshift),
          "inflate");
    }

    if (ref_mpi_once(ref_mpi))
      printf("layer%5d of%5d thickness %10.3e total %10.3e " REF_GLOB_FMT
             " nodes\n",
             layer + 1, nlayers, thickness, total,
             ref_node_n_global(ref_grid_node(ref_grid)));
  }

  ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "inflate");

  if (ref_mpi_once(ref_mpi)) {
    printf("inflated %d faces\n", ref_dict_n(faceids));
    printf("mach %f mach angle %f rad %f deg\n", mach, mach_angle_rad,
           ref_math_in_degrees(mach_angle_rad));
    printf("first thickness %f\n", first_thickness);
    printf("total thickness %f\n", total_thickness);
    printf("rate %f\n", rate);
    printf("layers %d\n", nlayers);
    printf("inflate method %s\n", inflate_method);
  }

  /* export via -x grid.ext and -f final-surf.tec and -q final-vol.plt */
  for (opt = 0; opt < argc - 1; opt++) {
    if (strcmp(argv[opt], "-x") == 0) {
      default_export_filename = REF_FALSE;
      if (ref_mpi_para(ref_mpi)) {
        if (ref_mpi_once(ref_mpi))
          printf("gather " REF_GLOB_FMT " nodes to %s\n",
                 ref_node_n_global(ref_grid_node(ref_grid)), argv[opt + 1]);
        RSS(ref_gather_by_extension(ref_grid, argv[opt + 1]), "gather -x");
        ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "gather");
      } else {
        if (ref_mpi_once(ref_mpi))
          printf("export " REF_GLOB_FMT " nodes to %s\n",
                 ref_node_n_global(ref_grid_node(ref_grid)), argv[opt + 1]);
        RSS(ref_export_by_extension(ref_grid, argv[opt + 1]), "export -x");
        ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "export");
      }
    }
  }

  if (default_export_filename) {
    if (ref_mpi_once(ref_mpi))
      printf("gather " REF_GLOB_FMT " nodes to %s\n",
             ref_node_n_global(ref_grid_node(ref_grid)), "inflated.b8.ugrid");
    RSS(ref_gather_by_extension(ref_grid, "inflated.b8.ugrid"), "gather");
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "gather");
  }

  RSS(ref_dict_free(faceids), "free");
  RSS(ref_grid_free(ref_grid), "grid");

  return REF_SUCCESS;
shutdown:
  if (ref_mpi_once(ref_mpi)) collar_help(argv[0]);
  RSS(ref_grid_free(ref_grid), "grid");
  return REF_FAILURE;
}